

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.hpp
# Opt level: O1

Cycles __thiscall
Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::Atari16k>::perform_bus_operation
          (Cartridge<Atari2600::Cartridge::Atari16k> *this,BusOperation operation,uint16_t address,
          uint8_t *value)

{
  Cycles *pCVar1;
  TIA *pTVar2;
  long lVar3;
  Cycles CVar4;
  IntType IVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  uint uVar13;
  uint8_t *__n;
  byte bVar14;
  
  iVar8 = 3;
  if (operation == Ready) {
    iVar8 = TIA::get_cycles_until_horizontal_blank
                      (&(this->super_Bus).tia_,
                       (Cycles)(this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>
                               .length_);
  }
  pCVar1 = &(this->super_Bus).cycles_since_speaker_update_;
  (pCVar1->super_WrappedInt<Cycles>).length_ =
       (pCVar1->super_WrappedInt<Cycles>).length_ + (long)iVar8;
  pCVar1 = &(this->super_Bus).cycles_since_video_update_;
  (pCVar1->super_WrappedInt<Cycles>).length_ =
       (pCVar1->super_WrappedInt<Cycles>).length_ + (long)iVar8;
  pCVar1 = &(this->super_Bus).cycles_since_6532_update_;
  (pCVar1->super_WrappedInt<Cycles>).length_ =
       (pCVar1->super_WrappedInt<Cycles>).length_ + (long)(iVar8 / 3);
  __n = (uint8_t *)(ulong)(operation != Write);
  if ((int)operation < 4 || operation == Write) {
    uVar13 = (uint)address;
    uVar9 = uVar13 & 0x1fff;
    if (0xfff < uVar9) {
      __n = (uint8_t *)(ulong)(uVar9 - 0x1ff6);
      if ((ushort)(uVar9 - 0x1ff6) < 4) {
        __n = (this->bus_extender_).super_BusExtender.rom_base_ +
              ((ulong)(uVar9 << 0xc) - 0x1ff6000);
        (this->bus_extender_).rom_ptr_ = __n;
      }
      if ((int)operation < 5) {
        __n = (this->bus_extender_).rom_ptr_;
        *value = __n[uVar13 & 0xfff];
      }
    }
    uVar9 = (uint)address;
    bVar14 = 0xff;
    if ((uVar9 & 0x1280) == 0x80) {
      if ((int)operation < 5) {
        bVar14 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.ram_[uVar9 & 0x7f];
      }
      else {
        __n = (uint8_t *)(ulong)(uVar9 & 0x7f);
        __n[(long)&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>] = *value;
      }
    }
    if ((address & 0x1080) == 0) {
      if ((int)operation < 5) {
        uVar13 = uVar9 & 0xf;
        __n = (uint8_t *)(ulong)uVar13;
        if ((ushort)uVar13 < 0xe) {
          if ((char)(1 << (sbyte)uVar13) == '\0') {
            if ((0xf00U >> uVar13 & 1) == 0) {
              bVar14 = bVar14 & (__n + 0x76c)[(long)this];
            }
            else {
              bVar14 = 0;
            }
          }
          else {
            bVar6 = TIA::get_collision_flags(&(this->super_Bus).tia_,uVar13);
            bVar14 = bVar14 & bVar6;
          }
        }
      }
      else {
        uVar13 = uVar13 & 0x3f;
        if ((ushort)uVar13 < 0x2d) {
          __n = (uint8_t *)
                ((long)&switchD_002fa40e::switchdataD_004c2e2c +
                (long)(int)(&switchD_002fa40e::switchdataD_004c2e2c)[uVar13]);
          switch(uVar13) {
          case 0:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            __n = value;
            TIA::set_sync(pTVar2,(bool)((*value & 2) >> 1));
            break;
          case 1:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            __n = value;
            TIA::set_blank(pTVar2,(bool)((*value & 2) >> 1));
            break;
          case 2:
            (this->m6502_).super_ProcessorBase.super_ProcessorStorage.ready_line_is_enabled_ = true;
            break;
          case 3:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::reset_horizontal_counter(pTVar2);
            this->horizontal_counter_resets_ = this->horizontal_counter_resets_ + 1;
            break;
          case 4:
          case 5:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_player_number_and_size(pTVar2,uVar13 - 4,*value);
            break;
          case 6:
          case 7:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_player_missile_colour(pTVar2,uVar13 - 6,*value);
            break;
          case 8:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_playfield_ball_colour(pTVar2,*value);
            break;
          case 9:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_background_colour(pTVar2,*value);
            break;
          case 10:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_playfield_control_and_ball_size(pTVar2,*value);
            break;
          case 0xb:
          case 0xc:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_player_reflected(pTVar2,uVar13 - 0xb,(*value & 8) == 0);
            break;
          default:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_playfield(pTVar2,(ushort)uVar13 - 0xd,*value);
            break;
          case 0x10:
          case 0x11:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_player_position(pTVar2,uVar13 - 0x10);
            break;
          case 0x12:
          case 0x13:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_missile_position(pTVar2,uVar13 - 0x12);
            break;
          case 0x14:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_ball_position(pTVar2);
            break;
          case 0x15:
          case 0x16:
            lVar3 = (this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>.length_;
            __n = (uint8_t *)(lVar3 % 6);
            (this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>.length_ =
                 (IntType)__n;
            Outputs::Speaker::PullLowpass<Atari2600::TIASound>::run_for
                      (&(this->super_Bus).speaker_,&(this->super_Bus).audio_queue_,
                       (Cycles)(lVar3 / 6));
            TIASound::set_control(&(this->super_Bus).tia_sound_,uVar13 - 0x15,*value);
            break;
          case 0x17:
          case 0x18:
            lVar3 = (this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>.length_;
            __n = (uint8_t *)(lVar3 % 6);
            (this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>.length_ =
                 (IntType)__n;
            Outputs::Speaker::PullLowpass<Atari2600::TIASound>::run_for
                      (&(this->super_Bus).speaker_,&(this->super_Bus).audio_queue_,
                       (Cycles)(lVar3 / 6));
            TIASound::set_divider(&(this->super_Bus).tia_sound_,uVar13 - 0x17,*value);
            break;
          case 0x19:
          case 0x1a:
            lVar3 = (this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>.length_;
            __n = (uint8_t *)(lVar3 % 6);
            (this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>.length_ =
                 (IntType)__n;
            Outputs::Speaker::PullLowpass<Atari2600::TIASound>::run_for
                      (&(this->super_Bus).speaker_,&(this->super_Bus).audio_queue_,
                       (Cycles)(lVar3 / 6));
            TIASound::set_volume(&(this->super_Bus).tia_sound_,uVar13 - 0x19,*value);
            break;
          case 0x1b:
          case 0x1c:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_player_graphic(pTVar2,uVar13 - 0x1b,*value);
            break;
          case 0x1d:
          case 0x1e:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            __n = value;
            TIA::set_missile_enable(pTVar2,uVar13 - 0x1d,(bool)((*value & 2) >> 1));
            break;
          case 0x1f:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            __n = value;
            TIA::set_ball_enable(pTVar2,(bool)((*value & 2) >> 1));
            break;
          case 0x20:
          case 0x21:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_player_motion(pTVar2,uVar13 - 0x20,*value);
            break;
          case 0x22:
          case 0x23:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_missile_motion(pTVar2,uVar13 - 0x22,*value);
            break;
          case 0x24:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::set_ball_motion(pTVar2,*value);
            break;
          case 0x25:
          case 0x26:
            TIA::set_player_delay(&(this->super_Bus).tia_,uVar13 - 0x25,(bool)(*value & 1));
            break;
          case 0x27:
            TIA::set_ball_delay(&(this->super_Bus).tia_,(bool)(*value & 1));
            break;
          case 0x28:
          case 0x29:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            __n = value;
            TIA::set_missile_position_to_player(pTVar2,uVar13 - 0x28,(bool)((*value & 2) >> 1));
            break;
          case 0x2a:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::move(pTVar2);
            break;
          case 0x2b:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::clear_motion(pTVar2);
            break;
          case 0x2c:
            pTVar2 = &(this->super_Bus).tia_;
            CVar4.super_WrappedInt<Cycles>.length_ =
                 (WrappedInt<Cycles>)
                 (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_;
            (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_ = 0;
            TIA::run_for(pTVar2,CVar4);
            TIA::clear_collision_flags(pTVar2);
          }
        }
      }
    }
    if ((uVar9 & 0x1280) == 0x280) {
      uVar13 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.value;
      pCVar1 = &(this->super_Bus).cycles_since_6532_update_;
      IVar5 = (pCVar1->super_WrappedInt<Cycles>).length_;
      uVar10 = uVar13 - (int)(pCVar1->super_WrappedInt<Cycles>).length_;
      (this->super_Bus).cycles_since_6532_update_.super_WrappedInt<Cycles>.length_ = 0;
      if (uVar13 < (uint)IVar5) {
        (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.value = uVar10 & 0xff;
        (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.activeShift = 0;
        bVar6 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_status_;
        __n = (uint8_t *)CONCAT71((int7)((ulong)__n >> 8),bVar6);
        (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_status_ = bVar6 | 0x80;
        bVar7 = true;
        if ((this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.interrupt_enabled ==
            false) {
          if ((bVar6 & 0x40) == 0) {
            bVar7 = false;
          }
          else {
            bVar7 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.a7_interrupt_.enabled;
          }
        }
        (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_line_ = bVar7;
      }
      else {
        (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.value = uVar10;
      }
      if ((int)operation < 5) {
        switch(uVar9 & 7) {
        default:
          bVar6 = *(byte *)((long)((this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.port_ +
                                  3) + (ulong)((uVar9 & 7) >> 1));
          bVar6 = ((&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.port_[0].output)
                   [uVar9 & 6] ^ bVar6) &
                  (&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.port_[0].output_mask)
                  [uVar9 & 6] ^ bVar6;
          break;
        case 1:
        case 3:
          bVar6 = (&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.port_[0].output_mask)
                  [uVar9 & 6];
          break;
        case 4:
        case 6:
          uVar9 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.value;
          uVar13 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.activeShift;
          bVar6 = (byte)(uVar9 >> ((byte)uVar13 & 0x1f));
          (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.interrupt_enabled =
               (bool)((byte)address >> 3 & 1);
          bVar12 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_status_;
          (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_status_ = bVar12 & 0x7f
          ;
          (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_line_ =
               (bool)((char)(bVar12 * '\x02') >> 7 &
                     (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.a7_interrupt_.enabled)
          ;
          uVar10 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.writtenShift;
          iVar11 = uVar10 - uVar13;
          if (iVar11 != 0) {
            bVar12 = (byte)iVar11;
            (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.value =
                 ~(-1 << (bVar12 & 0x1f)) | uVar9 << (bVar12 & 0x1f);
            (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.activeShift = uVar10;
          }
          break;
        case 5:
        case 7:
          bVar6 = (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_status_;
          (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_status_ = bVar6 & 0xbf;
          if ((-1 < (char)bVar6) ||
             (bVar7 = true,
             (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.timer_.interrupt_enabled ==
             false)) {
            bVar7 = false;
          }
          (this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>.interrupt_line_ = bVar7;
        }
        bVar14 = bVar14 & bVar6;
      }
      else {
        MOS::MOS6532<Atari2600::PIA>::write
                  (&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>,uVar9,
                   (void *)(ulong)*value,(size_t)__n);
      }
    }
    if ((int)operation < 5) {
      *value = *value & bVar14;
    }
  }
  iVar11 = TIA::get_cycles_until_horizontal_blank
                     (&(this->super_Bus).tia_,
                      (Cycles)(this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.
                              length_);
  if (iVar11 == 0) {
    (this->m6502_).super_ProcessorBase.super_ProcessorStorage.ready_is_active_ = false;
    (this->m6502_).super_ProcessorBase.super_ProcessorStorage.ready_line_is_enabled_ = false;
  }
  return (Cycles)(WrappedInt<Cycles>)(long)(iVar8 / 3);
}

Assistant:

Cycles perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			uint8_t returnValue = 0xff;
			int cycles_run_for = 3;

			// this occurs as a feedback loop: the 2600 requests ready, then performs the cycles_run_for
			// leap to the end of ready only once ready is signalled because on a 6502 ready doesn't take
			// effect until the next read; therefore it isn't safe to assume that signalling ready immediately
			// skips to the end of the line.
			if(operation == CPU::MOS6502::BusOperation::Ready)
				cycles_run_for = tia_.get_cycles_until_horizontal_blank(cycles_since_video_update_);

			cycles_since_speaker_update_ += Cycles(cycles_run_for);
			cycles_since_video_update_ += Cycles(cycles_run_for);
			cycles_since_6532_update_ += Cycles(cycles_run_for / 3);
			bus_extender_.advance_cycles(cycles_run_for / 3);

			if(isAccessOperation(operation)) {
				// give the cartridge a chance to respond to the bus access
				bus_extender_.perform_bus_operation(operation, address, value);

				// check for a RIOT RAM access
				if((address&0x1280) == 0x80) {
					if(isReadOperation(operation)) {
						returnValue &= mos6532_.get_ram(address);
					} else {
						mos6532_.set_ram(address, *value);
					}
				}

				// check for a TIA access
				if(!(address&0x1080)) {
					if(isReadOperation(operation)) {
						const uint16_t decodedAddress = address & 0xf;
						switch(decodedAddress) {
							case 0x00:		// missile 0 / player collisions
							case 0x01:		// missile 1 / player collisions
							case 0x02:		// player 0 / playfield / ball collisions
							case 0x03:		// player 1 / playfield / ball collisions
							case 0x04:		// missile 0 / playfield / ball collisions
							case 0x05:		// missile 1 / playfield / ball collisions
							case 0x06:		// ball / playfield collisions
							case 0x07:		// player / player, missile / missile collisions
								returnValue &= tia_.get_collision_flags(decodedAddress);
							break;

							case 0x08:
							case 0x09:
							case 0x0a:
							case 0x0b:
								// TODO: pot ports
								returnValue &= 0;
							break;

							case 0x0c:
							case 0x0d:
								returnValue &= tia_input_value_[decodedAddress - 0x0c];
							break;
						}
					} else {
						const uint16_t decodedAddress = address & 0x3f;
						switch(decodedAddress) {
							case 0x00:	update_video(); tia_.set_sync(*value & 0x02);		break;
							case 0x01:	update_video();	tia_.set_blank(*value & 0x02);		break;

							case 0x02:	m6502_.set_ready_line(true);						break;
							case 0x03:
								update_video();
								tia_.reset_horizontal_counter();
								horizontal_counter_resets_++;
							break;
								// TODO: audio will now be out of synchronisation. Fix.

							case 0x04:
							case 0x05:	update_video();	tia_.set_player_number_and_size(decodedAddress - 0x04, *value);	break;
							case 0x06:
							case 0x07:	update_video();	tia_.set_player_missile_colour(decodedAddress - 0x06, *value);		break;
							case 0x08:	update_video();	tia_.set_playfield_ball_colour(*value);								break;
							case 0x09:	update_video();	tia_.set_background_colour(*value);									break;
							case 0x0a:	update_video();	tia_.set_playfield_control_and_ball_size(*value);					break;
							case 0x0b:
							case 0x0c:	update_video();	tia_.set_player_reflected(decodedAddress - 0x0b, !((*value)&8));	break;
							case 0x0d:
							case 0x0e:
							case 0x0f:	update_video();	tia_.set_playfield(decodedAddress - 0x0d, *value);					break;
							case 0x10:
							case 0x11:	update_video(); tia_.set_player_position(decodedAddress - 0x10);					break;
							case 0x12:
							case 0x13:	update_video(); tia_.set_missile_position(decodedAddress - 0x12);					break;
							case 0x14:	update_video();	tia_.set_ball_position();											break;
							case 0x1b:
							case 0x1c:	update_video(); tia_.set_player_graphic(decodedAddress - 0x1b, *value);				break;
							case 0x1d:
							case 0x1e:	update_video(); tia_.set_missile_enable(decodedAddress - 0x1d, (*value)&2);			break;
							case 0x1f:	update_video(); tia_.set_ball_enable((*value)&2);									break;
							case 0x20:
							case 0x21:	update_video(); tia_.set_player_motion(decodedAddress - 0x20, *value);				break;
							case 0x22:
							case 0x23:	update_video(); tia_.set_missile_motion(decodedAddress - 0x22, *value);				break;
							case 0x24:	update_video(); tia_.set_ball_motion(*value);										break;
							case 0x25:
							case 0x26:	tia_.set_player_delay(decodedAddress - 0x25, (*value)&1);							break;
							case 0x27:	tia_.set_ball_delay((*value)&1);													break;
							case 0x28:
							case 0x29:	update_video(); tia_.set_missile_position_to_player(decodedAddress - 0x28, (*value)&2);		break;
							case 0x2a:	update_video(); tia_.move();														break;
							case 0x2b:	update_video(); tia_.clear_motion();												break;
							case 0x2c:	update_video(); tia_.clear_collision_flags();										break;

							case 0x15:
							case 0x16:	update_audio(); tia_sound_.set_control(decodedAddress - 0x15, *value);				break;
							case 0x17:
							case 0x18:	update_audio(); tia_sound_.set_divider(decodedAddress - 0x17, *value);				break;
							case 0x19:
							case 0x1a:	update_audio(); tia_sound_.set_volume(decodedAddress - 0x19, *value);				break;
						}
					}
				}

				// check for a PIA access
				if((address&0x1280) == 0x280) {
					update_6532();
					if(isReadOperation(operation)) {
						returnValue &= mos6532_.read(address);
					} else {
						mos6532_.write(address, *value);
					}
				}

				if(isReadOperation(operation)) {
					*value &= returnValue;
				}
			}

			if(!tia_.get_cycles_until_horizontal_blank(cycles_since_video_update_)) m6502_.set_ready_line(false);

			return Cycles(cycles_run_for / 3);
		}